

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_is_valid_var(secp256k1_ge *a)

{
  int iVar1;
  secp256k1_fe x3;
  secp256k1_fe y2;
  
  secp256k1_ge_verify(a);
  iVar1 = 0;
  if (a->infinity == 0) {
    secp256k1_fe_sqr(&y2,&a->y);
    secp256k1_fe_sqr(&x3,&a->x);
    secp256k1_fe_mul(&x3,&x3,&a->x);
    secp256k1_fe_add_int(&x3,7);
    iVar1 = secp256k1_fe_equal(&y2,&x3);
  }
  return iVar1;
}

Assistant:

static int secp256k1_ge_is_valid_var(const secp256k1_ge *a) {
    secp256k1_fe y2, x3;
    SECP256K1_GE_VERIFY(a);

    if (a->infinity) {
        return 0;
    }
    /* y^2 = x^3 + 7 */
    secp256k1_fe_sqr(&y2, &a->y);
    secp256k1_fe_sqr(&x3, &a->x); secp256k1_fe_mul(&x3, &x3, &a->x);
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_equal(&y2, &x3);
}